

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O0

int envy_bios_parse_xpio(envy_bios *bios,envy_bios_xpio *xpio,int idx)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  envy_bios_gpio_entry *peVar4;
  int local_4c;
  uint16_t val;
  int j;
  envy_bios_gpio_entry *peStack_40;
  uint8_t bytes [5];
  envy_bios_gpio_entry *entry;
  int i;
  int wantrlen;
  int wanthlen;
  int iStack_24;
  uint8_t byte2;
  int err;
  int idx_local;
  envy_bios_xpio *xpio_local;
  envy_bios *bios_local;
  
  if (xpio->offset == 0) {
    bios_local._4_4_ = 0;
  }
  else {
    wanthlen = 0;
    iStack_24 = idx;
    _err = xpio;
    xpio_local = (envy_bios_xpio *)bios;
    uVar2 = bios_u8(bios,(uint)xpio->offset,&xpio->version);
    wanthlen = uVar2 | wanthlen;
    uVar2 = bios_u8((envy_bios *)xpio_local,_err->offset + 1,&_err->hlen);
    wanthlen = uVar2 | wanthlen;
    uVar2 = bios_u8((envy_bios *)xpio_local,_err->offset + 2,&_err->entriesnum);
    wanthlen = uVar2 | wanthlen;
    uVar2 = bios_u8((envy_bios *)xpio_local,_err->offset + 3,&_err->rlen);
    wanthlen = uVar2 | wanthlen;
    uVar2 = bios_u8((envy_bios *)xpio_local,_err->offset + 4,&_err->type);
    wanthlen = uVar2 | wanthlen;
    uVar2 = bios_u8((envy_bios *)xpio_local,_err->offset + 5,&_err->addr);
    wanthlen = uVar2 | wanthlen;
    uVar2 = bios_u8((envy_bios *)xpio_local,_err->offset + 6,(uint8_t *)((long)&wantrlen + 3));
    wanthlen = uVar2 | wanthlen;
    if (wanthlen == 0) {
      envy_bios_block((envy_bios *)xpio_local,(uint)_err->offset,
                      (uint)_err->hlen + (uint)_err->rlen * (uint)_err->entriesnum,"XPIO",iStack_24)
      ;
      _err->unk02_0 = wantrlen._3_1_ & 0xf;
      _err->bus = (byte)((int)(uint)wantrlen._3_1_ >> 4) & 1;
      _err->unk02_5 = (uint8_t)((int)(uint)wantrlen._3_1_ >> 5);
      if (_err->version != *(uint8_t *)((long)&xpio_local[0x11].entries + 3)) {
        fprintf(_stderr,"XPIO version mismatch with XPIODIR\n");
      }
      if (_err->version == '0') {
        entry._4_4_ = 2;
      }
      else {
        if (_err->version != '@') {
          fprintf(_stderr,"Unknown XPIO table version %d.%d\n",
                  (ulong)(uint)((int)(uint)_err->version >> 4),(ulong)(_err->version & 0xf));
          return -0x16;
        }
        entry._4_4_ = 4;
        if (xpio_local[0x11].version == 'A') {
          entry._4_4_ = 5;
        }
        else if (_err->rlen == '\x02') {
          fprintf(_stderr,"XPIO version 4.0 with 2-byte entries!\n");
          _err->rlen = '\x04';
        }
      }
      if (_err->hlen < 7) {
        fprintf(_stderr,"XPIO table header too short [%d < %d]\n",(ulong)_err->hlen,7);
        bios_local._4_4_ = -0x16;
      }
      else if (_err->rlen < entry._4_4_) {
        fprintf(_stderr,"XPIO table record too short [%d < %d]\n",(ulong)_err->rlen,
                (ulong)entry._4_4_);
        bios_local._4_4_ = -0x16;
      }
      else {
        if (7 < _err->hlen) {
          fprintf(_stderr,"XPIO table header longer than expected [%d > %d]\n",(ulong)_err->hlen,7);
        }
        if (entry._4_4_ < _err->rlen) {
          fprintf(_stderr,"XPIO table record longer than expected [%d > %d]\n",(ulong)_err->rlen,
                  (ulong)entry._4_4_);
        }
        peVar4 = (envy_bios_gpio_entry *)calloc((ulong)_err->entriesnum,0x12);
        _err->entries = peVar4;
        if (_err->entries == (envy_bios_gpio_entry *)0x0) {
          bios_local._4_4_ = -0xc;
        }
        else {
          for (entry._0_4_ = 0; (int)entry < (int)(uint)_err->entriesnum;
              entry._0_4_ = (int)entry + 1) {
            peStack_40 = _err->entries + (int)entry;
            peStack_40->offset =
                 _err->offset + (ushort)_err->hlen + (ushort)_err->rlen * (short)(int)entry;
            memset((void *)((long)&val + 1),0,5);
            local_4c = 0;
            while( true ) {
              bVar1 = false;
              if (local_4c < 5) {
                bVar1 = local_4c < (int)(uint)_err->rlen;
              }
              if (!bVar1) break;
              iVar3 = bios_u8((envy_bios *)xpio_local,(uint)peStack_40->offset + local_4c,
                              (uint8_t *)((long)&val + (long)local_4c + 1));
              if (iVar3 != 0 || wanthlen != 0) {
                return -0xe;
              }
              local_4c = local_4c + 1;
              wanthlen = 0;
            }
            uVar2 = (uint)xpio_local[0x11].version;
            if (uVar2 - 0x30 < 2) {
              if (_err->rlen < 2) {
                return -0xe;
              }
              peStack_40->line = val._1_1_ & 0x1f;
              peStack_40->tag = (byte)((int)(uint)stack0xffffffffffffffbb >> 5) & 0x3f;
              peStack_40->log[0] = (byte)((int)(uint)stack0xffffffffffffffbb >> 0xb) & 3;
              peStack_40->log[1] = (byte)((int)(uint)stack0xffffffffffffffbb >> 0xd) & 3;
              peStack_40->param = (uint8_t)((int)(uint)stack0xffffffffffffffbb >> 0xf);
            }
            else if (uVar2 == 0x40) {
              if (_err->rlen < 4) {
                return -0xe;
              }
              peStack_40->line = val._1_1_ & 0x1f;
              peStack_40->unk40_0 = (uint8_t)((int)(uint)val._1_1_ >> 5);
              peStack_40->tag = (uint8_t)j;
              peStack_40->unk40_2 = j._1_1_;
              peStack_40->def = j._2_1_ & 1;
              peStack_40->mode = (byte)((int)(uint)j._2_1_ >> 1) & 3;
              peStack_40->log[0] = (byte)((int)(uint)j._2_1_ >> 3) & 3;
              peStack_40->log[1] = (byte)((int)(uint)j._2_1_ >> 5) & 3;
              peStack_40->param = (uint8_t)((int)(uint)j._2_1_ >> 7);
            }
            else {
              if (uVar2 != 0x41) {
                abort();
              }
              if (_err->rlen < 5) {
                return -0xe;
              }
              peStack_40->line = val._1_1_ & 0x3f;
              peStack_40->io = (byte)((int)(uint)val._1_1_ >> 6) & 1;
              peStack_40->def = (uint8_t)((int)(uint)val._1_1_ >> 7);
              peStack_40->tag = (uint8_t)j;
              peStack_40->spec_out = j._1_1_;
              peStack_40->spec_in = j._2_1_ & 0x1f;
              peStack_40->gsync = (byte)((int)(uint)j._2_1_ >> 5) & 1;
              peStack_40->reserved = (byte)((int)(uint)j._2_1_ >> 6) & 1;
              peStack_40->param = (uint8_t)((int)(uint)j._2_1_ >> 7);
              peStack_40->lockpin = j._3_1_ & 0xf;
              peStack_40->log[0] = (byte)((int)(uint)j._3_1_ >> 4) & 3;
              peStack_40->log[1] = (uint8_t)((int)(uint)j._3_1_ >> 6);
            }
          }
          _err->valid = '\x01';
          bios_local._4_4_ = 0;
        }
      }
    }
    else {
      bios_local._4_4_ = -0xe;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_xpio (struct envy_bios *bios, struct envy_bios_xpio *xpio, int idx) {
	if (!xpio->offset)
		return 0;
	int err = 0;
	uint8_t byte2;
	err |= bios_u8(bios, xpio->offset, &xpio->version);
	err |= bios_u8(bios, xpio->offset+1, &xpio->hlen);
	err |= bios_u8(bios, xpio->offset+2, &xpio->entriesnum);
	err |= bios_u8(bios, xpio->offset+3, &xpio->rlen);
	err |= bios_u8(bios, xpio->offset+4, &xpio->type);
	err |= bios_u8(bios, xpio->offset+5, &xpio->addr);
	err |= bios_u8(bios, xpio->offset+6, &byte2);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, xpio->offset, xpio->hlen + xpio->rlen * xpio->entriesnum, "XPIO", idx);
	xpio->unk02_0 = byte2 & 0xf;
	xpio->bus = byte2 >> 4 & 1;
	xpio->unk02_5 = byte2 >> 5;
	int wanthlen = 0;
	int wantrlen = 0;
	if (xpio->version != bios->gpio.xpiodir.version)
		ENVY_BIOS_WARN("XPIO version mismatch with XPIODIR\n");
	switch (xpio->version) {
		case 0x30:
			wanthlen = 7;
			wantrlen = 2;
			break;
		case 0x40:
			wanthlen = 7;
			wantrlen = 4;
			if (bios->gpio.version == 0x41)
				wantrlen = 5;
			else if (xpio->rlen == 2) {
				ENVY_BIOS_WARN("XPIO version 4.0 with 2-byte entries!\n");
				xpio->rlen = 4;
			}
			break;
		default:
			ENVY_BIOS_ERR("Unknown XPIO table version %d.%d\n", xpio->version >> 4, xpio->version & 0xf);
			return -EINVAL;
	}
	if (xpio->hlen < wanthlen) {
		ENVY_BIOS_ERR("XPIO table header too short [%d < %d]\n", xpio->hlen, wanthlen);
		return -EINVAL;
	}
	if (xpio->rlen < wantrlen) {
		ENVY_BIOS_ERR("XPIO table record too short [%d < %d]\n", xpio->rlen, wantrlen);
		return -EINVAL;
	}
	if (xpio->hlen > wanthlen) {
		ENVY_BIOS_WARN("XPIO table header longer than expected [%d > %d]\n", xpio->hlen, wanthlen);
	}
	if (xpio->rlen > wantrlen) {
		ENVY_BIOS_WARN("XPIO table record longer than expected [%d > %d]\n", xpio->rlen, wantrlen);
	}
	xpio->entries = calloc(xpio->entriesnum, sizeof *xpio->entries);
	if (!xpio->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < xpio->entriesnum; i++) {
		struct envy_bios_gpio_entry *entry = &xpio->entries[i];
		entry->offset = xpio->offset + xpio->hlen + xpio->rlen * i;
		/* note: structure is the same as GPIO, but tags are different, and some fields don't make sense */
		uint8_t bytes[5] = { 0 };
		int j;
		for (j = 0; j < 5 && j < xpio->rlen; j++) {
			err |= bios_u8(bios, entry->offset+j, &bytes[j]);
			if (err)
				return -EFAULT;
		}
		uint16_t val;
		/* because someone forgot to bump XPIO version number on 4.1... */
		switch (bios->gpio.version) {
			case 0x30:
			case 0x31:
				if (xpio->rlen < 2)
					return -EFAULT;
				val = bytes[0] | bytes[1] << 8;
				entry->line = val & 0x1f;
				entry->tag = val >> 5 & 0x3f;
				entry->log[0] = val >> 11 & 3;
				entry->log[1] = val >> 13 & 3;
				entry->param = val >> 15 & 1;
				break;
			case 0x40:
				if (xpio->rlen < 4)
					return -EFAULT;
				entry->line = bytes[0] & 0x1f;
				entry->unk40_0 = bytes[0] >> 5 & 7;
				entry->tag = bytes[1];
				entry->unk40_2 = bytes[2];
				entry->def = bytes[3] & 1;
				entry->mode = bytes[3] >> 1 & 3;
				entry->log[0] = bytes[3] >> 3 & 3;
				entry->log[1] = bytes[3] >> 5 & 3;
				entry->param = bytes[3] >> 7 & 1;
				break;
			case 0x41:
				if (xpio->rlen < 5)
					return -EFAULT;
				entry->line = bytes[0] & 0x3f;
				entry->io = bytes[0] >> 6 & 1;
				entry->def = bytes[0] >> 7 & 1;
				entry->tag = bytes[1];
				entry->spec_out = bytes[2];
				entry->spec_in = bytes[3] & 0x1f;
				entry->gsync = bytes[3] >> 5 & 1;
				entry->reserved = bytes[3] >> 6 & 1;
				entry->param = bytes[3] >> 7 & 1;
				entry->lockpin = bytes[4] & 0xf;
				entry->log[0] = bytes[4] >> 4 & 3;
				entry->log[1] = bytes[4] >> 6 & 3;
				break;
			default:
				abort();
		}
	}
	xpio->valid = 1;
	return 0;
}